

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O3

char * CaptureDecimalInteger(char *szDataPtr,char *szDataEnd,PDWORD PtrValue)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  
  pbVar3 = (byte *)szDataPtr;
  if (szDataPtr < szDataEnd) {
    do {
      szDataPtr = (char *)pbVar3;
      if (*szDataPtr != 0x20) break;
      pbVar3 = (byte *)szDataPtr + 1;
      szDataPtr = szDataEnd;
    } while (pbVar3 != (byte *)szDataEnd);
  }
  uVar4 = 0;
  pbVar3 = (byte *)szDataPtr;
  if (szDataPtr < szDataEnd) {
    lVar5 = (long)szDataEnd - (long)szDataPtr;
    pbVar1 = (byte *)szDataPtr + lVar5;
    uVar4 = 0;
    do {
      bVar2 = *szDataPtr;
      pbVar3 = (byte *)szDataPtr;
      if (bVar2 == 0x20) break;
      if ((9 < (byte)(bVar2 - 0x30)) || (uVar6 = bVar2 - 0x30, CARRY4(uVar4,uVar6))) {
        return (char *)0x0;
      }
      uVar4 = uVar6 + uVar4 * 10;
      szDataPtr = (char *)((byte *)szDataPtr + 1);
      lVar5 = lVar5 + -1;
      pbVar3 = pbVar1;
    } while (lVar5 != 0);
  }
  *PtrValue = uVar4;
  return (char *)pbVar3;
}

Assistant:

static const char * CaptureDecimalInteger(const char * szDataPtr, const char * szDataEnd, PDWORD PtrValue)
{
    DWORD TotalValue = 0;
    DWORD AddValue = 0;

    // Skip all spaces
    while (szDataPtr < szDataEnd && szDataPtr[0] == ' ')
        szDataPtr++;

    // Load the number
    while (szDataPtr < szDataEnd && szDataPtr[0] != ' ')
    {
        // Must only contain decimal digits ('0' - '9')
        if (!IsCharDigit(szDataPtr[0]))
            return NULL;

        // Get the next value and verify overflow
        AddValue = szDataPtr[0] - '0';
        if ((TotalValue + AddValue) < TotalValue)
            return NULL;

        TotalValue = (TotalValue * 10) + AddValue;
        szDataPtr++;
    }

    // Give the result
    PtrValue[0] = TotalValue;
    return szDataPtr;
}